

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp.c
# Opt level: O0

void udp_ep_accept(void *arg,nni_aio *aio)

{
  _Bool _Var1;
  udp_ep *ep;
  nni_aio *aio_local;
  void *arg_local;
  
  nni_aio_reset(aio);
  nni_mtx_lock((nni_mtx *)((long)arg + 8));
  if ((*(byte *)((long)arg + 0x36) & 1) == 0) {
    _Var1 = nni_aio_start(aio,udp_ep_cancel,arg);
    if (_Var1) {
      nni_aio_list_append((nni_list *)((long)arg + 0x9f0),aio);
      udp_ep_match((udp_ep *)arg);
      nni_mtx_unlock((nni_mtx *)((long)arg + 8));
    }
    else {
      nni_mtx_unlock((nni_mtx *)((long)arg + 8));
    }
  }
  else {
    nni_mtx_unlock((nni_mtx *)((long)arg + 8));
    nni_aio_finish_error(aio,NNG_ECLOSED);
  }
  return;
}

Assistant:

static void
udp_ep_accept(void *arg, nni_aio *aio)
{
	udp_ep *ep = arg;

	nni_aio_reset(aio);
	nni_mtx_lock(&ep->mtx);
	if (ep->closed) {
		nni_mtx_unlock(&ep->mtx);
		nni_aio_finish_error(aio, NNG_ECLOSED);
		return;
	}
	if (!nni_aio_start(aio, udp_ep_cancel, ep)) {
		nni_mtx_unlock(&ep->mtx);
		return;
	}
	nni_aio_list_append(&ep->connaios, aio);
	udp_ep_match(ep);
	nni_mtx_unlock(&ep->mtx);
}